

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# double.hh
# Opt level: O2

int __thiscall
RuleDoubleLoad::clone
          (RuleDoubleLoad *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  bool bVar1;
  RuleDoubleLoad *this_00;
  string *nm;
  
  nm = &(this->super_Rule).basegroup;
  bVar1 = ActionGroupList::contains((ActionGroupList *)__fn,nm);
  if (bVar1) {
    this_00 = (RuleDoubleLoad *)operator_new(0x58);
    RuleDoubleLoad(this_00,nm);
  }
  else {
    this_00 = (RuleDoubleLoad *)0x0;
  }
  return (int)this_00;
}

Assistant:

virtual Rule *clone(const ActionGroupList &grouplist) const {
    if (!grouplist.contains(getGroup())) return (Rule *)0;
    return new RuleDoubleLoad(getGroup());
  }